

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderEntPush(xmlTextReaderPtr reader,xmlNodePtr value)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  xmlGenericErrorFunc UNRECOVERED_JUMPTABLE;
  char *pcVar6;
  void *pvVar7;
  
  if (reader->entMax < 1) {
    reader->entMax = 10;
    ppxVar2 = (xmlNodePtr *)(*xmlMalloc)(0x50);
    reader->entTab = ppxVar2;
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      pp_Var3 = __xmlGenericError();
      UNRECOVERED_JUMPTABLE = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      pvVar7 = *ppvVar4;
      pcVar6 = "xmlMalloc failed !\n";
      uVar5 = extraout_RDX_00;
      goto LAB_0019cf3f;
    }
  }
  iVar1 = reader->entMax;
  if (iVar1 <= reader->entNr) {
    reader->entMax = iVar1 * 2;
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(reader->entTab,(long)iVar1 << 4);
    reader->entTab = ppxVar2;
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      pp_Var3 = __xmlGenericError();
      UNRECOVERED_JUMPTABLE = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      pvVar7 = *ppvVar4;
      pcVar6 = "xmlRealloc failed !\n";
      uVar5 = extraout_RDX;
LAB_0019cf3f:
      iVar1 = (*UNRECOVERED_JUMPTABLE)(pvVar7,pcVar6,uVar5,UNRECOVERED_JUMPTABLE);
      return iVar1;
    }
  }
  iVar1 = reader->entNr;
  reader->entTab[iVar1] = value;
  reader->ent = value;
  iVar1 = iVar1 + 1;
  reader->entNr = iVar1;
  return iVar1;
}

Assistant:

static int
xmlTextReaderEntPush(xmlTextReaderPtr reader, xmlNodePtr value)
{
    if (reader->entMax <= 0) {
	reader->entMax = 10;
	reader->entTab = (xmlNodePtr *) xmlMalloc(reader->entMax *
		                                  sizeof(reader->entTab[0]));
        if (reader->entTab == NULL) {
            xmlGenericError(xmlGenericErrorContext, "xmlMalloc failed !\n");
            return (0);
        }
    }
    if (reader->entNr >= reader->entMax) {
        reader->entMax *= 2;
        reader->entTab =
            (xmlNodePtr *) xmlRealloc(reader->entTab,
                                      reader->entMax *
                                      sizeof(reader->entTab[0]));
        if (reader->entTab == NULL) {
            xmlGenericError(xmlGenericErrorContext, "xmlRealloc failed !\n");
            return (0);
        }
    }
    reader->entTab[reader->entNr] = value;
    reader->ent = value;
    return (reader->entNr++);
}